

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O3

void __thiscall Js::DelayedFreeArrayBuffer::ReleaseOnlyNonMarkedObject(DelayedFreeArrayBuffer *this)

{
  _func_int **pp_Var1;
  HeapAllocator *this_00;
  SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *buffer;
  bool bVar2;
  int iVar3;
  Type *ppAVar4;
  undefined1 local_38 [8];
  EditingIterator iter;
  
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  local_38 = (undefined1  [8])this;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
       this;
  bVar2 = SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>::
          EditingIterator::Next((EditingIterator *)local_38);
  if (bVar2) {
    do {
      ppAVar4 = SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                ::Iterator::Data((Iterator *)local_38);
      iVar3 = (*(*ppAVar4)->_vptr_ArrayBufferContentForDelayedFreeBase[6])();
      pp_Var1 = (*ppAVar4)->_vptr_ArrayBufferContentForDelayedFreeBase;
      if ((char)iVar3 == '\0') {
        (*pp_Var1[2])();
        (*(*ppAVar4)->_vptr_ArrayBufferContentForDelayedFreeBase[7])();
        buffer = iter.super_EditingIterator.super_Iterator.list;
        this_00 = (HeapAllocator *)
                  (((SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                     *)((long)local_38 + 0x10))->super_SListNodeBase<Memory::HeapAllocator>).next;
        SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>::
        EditingIterator::UnlinkCurrentNode((EditingIterator *)local_38);
        Memory::HeapAllocator::Free(this_00,buffer,0x10);
      }
      else {
        (*pp_Var1[5])(*ppAVar4,0);
      }
      bVar2 = SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
              ::EditingIterator::Next((EditingIterator *)local_38);
    } while (bVar2);
  }
  return;
}

Assistant:

void DelayedFreeArrayBuffer::ReleaseOnlyNonMarkedObject()
    {
        FOREACH_SLIST_ENTRY_EDITING(ArrayBufferContentForDelayedFreeBase*, item, &this->listOfBuffers, iter)
        {
            if (!item->IsMarked())
            {
                item->Release();
                item->ClearSelfOnly();
                iter.RemoveCurrent();
            }
            else
            {
                // Reset the mark bit
                item->SetMarkBit(false);
            }
        } NEXT_SLIST_ENTRY_EDITING
    }